

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

GeoPoly * geopolyBBox(sqlite3_context *context,sqlite3_value *pPoly,RtreeCoord *aCoord,int *pRc)

{
  GeoPoly *pGVar1;
  GeoPoly *p;
  uint uVar2;
  uint uVar3;
  RtreeCoord RVar4;
  RtreeCoord RVar5;
  RtreeCoord RVar6;
  RtreeCoord RVar7;
  RtreeCoord RVar8;
  RtreeCoord RVar9;
  undefined8 local_58;
  
  if (aCoord == (RtreeCoord *)0x0 || pPoly != (sqlite3_value *)0x0) {
    p = geopolyFuncParam(context,pPoly,pRc);
    if (p == (GeoPoly *)0x0) {
      if (aCoord == (RtreeCoord *)0x0) {
        return (GeoPoly *)0x0;
      }
      *(undefined8 *)aCoord = 0;
      *(undefined8 *)(aCoord + 2) = 0;
      return (GeoPoly *)0x0;
    }
    RVar6.i = (int)*(undefined8 *)p->a;
    RVar8.i = (int)((ulong)*(undefined8 *)p->a >> 0x20);
    uVar3 = 1;
    uVar2 = 0;
    RVar9.i = RVar8.i;
    RVar5.i = RVar6.i;
    while (uVar2 = uVar3 & 0xff | uVar2, (int)uVar2 < p->nVertex) {
      RVar4 = (RtreeCoord)((RtreeCoord *)(p->a + (int)(uVar2 * 2)))->f;
      RVar7 = RVar4;
      if ((RVar4.f < RVar6.f) || (RVar7 = RVar6, RVar4.f <= RVar5.f)) {
        RVar4 = RVar5;
        RVar6 = RVar7;
      }
      RVar5 = (RtreeCoord)((RtreeCoord *)(p->a + (int)(uVar2 * 2 | 1)))->f;
      RVar7 = RVar5;
      if ((RVar5.f < RVar8.f) || (RVar7 = RVar8, RVar5.f <= RVar9.f)) {
        RVar5 = RVar9;
        RVar8 = RVar7;
      }
      uVar3 = uVar2 + 1;
      RVar9 = RVar5;
      RVar5 = RVar4;
      uVar2 = uVar3 & 0xffffff00;
    }
    if (pRc != (int *)0x0) {
      *pRc = 0;
    }
    local_58 = CONCAT44(RVar8.i,RVar5.i);
    if (aCoord != (RtreeCoord *)0x0) {
      sqlite3_free(p);
      aCoord->f = (RtreeValue)RVar6;
      *(undefined8 *)(aCoord + 1) = local_58;
      aCoord[3].f = (RtreeValue)RVar9;
      return (GeoPoly *)0x0;
    }
  }
  else {
    RVar6 = *aCoord;
    local_58 = *(undefined8 *)(aCoord + 1);
    RVar9 = aCoord[3];
    p = (GeoPoly *)0x0;
  }
  pGVar1 = (GeoPoly *)sqlite3_realloc64(p,0x28);
  if (pGVar1 == (GeoPoly *)0x0) {
    sqlite3_free(p);
    if (context != (sqlite3_context *)0x0) {
      sqlite3_result_error_nomem(context);
    }
    if (pRc != (int *)0x0) {
      *pRc = 7;
    }
    return (GeoPoly *)0x0;
  }
  pGVar1->nVertex = 4;
  pGVar1->hdr[0] = '\x01';
  pGVar1->hdr[1] = '\0';
  pGVar1->hdr[2] = '\0';
  pGVar1->hdr[3] = '\x04';
  pGVar1->a[0] = (GeoCoord)RVar6;
  pGVar1->a[1] = local_58._4_4_;
  pGVar1->a[2] = (GeoCoord)local_58;
  pGVar1->a[3] = local_58._4_4_;
  pGVar1->a[4] = (GeoCoord)local_58;
  *(RtreeCoord *)(pGVar1->a + 5) = RVar9;
  *(RtreeCoord *)(pGVar1->a + 6) = RVar6;
  *(RtreeCoord *)(pGVar1->a + 7) = RVar9;
  return pGVar1;
}

Assistant:

static GeoPoly *geopolyBBox(
  sqlite3_context *context,   /* For recording the error */
  sqlite3_value *pPoly,       /* The polygon */
  RtreeCoord *aCoord,         /* Results here */
  int *pRc                    /* Error code here */
){
  GeoPoly *pOut = 0;
  GeoPoly *p;
  float mnX, mxX, mnY, mxY;
  if( pPoly==0 && aCoord!=0 ){
    p = 0;
    mnX = aCoord[0].f;
    mxX = aCoord[1].f;
    mnY = aCoord[2].f;
    mxY = aCoord[3].f;
    goto geopolyBboxFill;
  }else{
    p = geopolyFuncParam(context, pPoly, pRc);
  }
  if( p ){
    int ii;
    mnX = mxX = GeoX(p,0);
    mnY = mxY = GeoY(p,0);
    for(ii=1; ii<p->nVertex; ii++){
      double r = GeoX(p,ii);
      if( r<mnX ) mnX = (float)r;
      else if( r>mxX ) mxX = (float)r;
      r = GeoY(p,ii);
      if( r<mnY ) mnY = (float)r;
      else if( r>mxY ) mxY = (float)r;
    }
    if( pRc ) *pRc = SQLITE_OK;
    if( aCoord==0 ){
      geopolyBboxFill:
      pOut = sqlite3_realloc64(p, GEOPOLY_SZ(4));
      if( pOut==0 ){
        sqlite3_free(p);
        if( context ) sqlite3_result_error_nomem(context);
        if( pRc ) *pRc = SQLITE_NOMEM;
        return 0;
      }
      pOut->nVertex = 4;
      ii = 1;
      pOut->hdr[0] = *(unsigned char*)&ii;
      pOut->hdr[1] = 0;
      pOut->hdr[2] = 0;
      pOut->hdr[3] = 4;
      GeoX(pOut,0) = mnX;
      GeoY(pOut,0) = mnY;
      GeoX(pOut,1) = mxX;
      GeoY(pOut,1) = mnY;
      GeoX(pOut,2) = mxX;
      GeoY(pOut,2) = mxY;
      GeoX(pOut,3) = mnX;
      GeoY(pOut,3) = mxY;
    }else{
      sqlite3_free(p);
      aCoord[0].f = mnX;
      aCoord[1].f = mxX;
      aCoord[2].f = mnY;
      aCoord[3].f = mxY;
    }
  }else if( aCoord ){
    memset(aCoord, 0, sizeof(RtreeCoord)*4);
  }
  return pOut;
}